

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int pager_link_page(Pager *pPager,Page *pPage)

{
  uint uVar1;
  Page *pPVar2;
  uint uVar3;
  sxu32 sVar4;
  Page **ppPVar5;
  Page **ppPVar6;
  Page **ppPVar7;
  bool bVar8;
  
  uVar1 = pPager->nSize;
  uVar3 = uVar1 - 1 & (uint)pPage->pgno;
  ppPVar7 = pPager->apHash;
  pPage->pNextCollide = ppPVar7[uVar3];
  if (ppPVar7[uVar3] != (Page *)0x0) {
    ppPVar7[uVar3]->pPrevCollide = pPage;
  }
  ppPVar7[uVar3] = pPage;
  pPVar2 = pPager->pAll;
  if (pPVar2 != (Page *)0x0) {
    pPage->pNext = pPVar2;
    pPVar2->pPrev = pPage;
  }
  pPager->pAll = pPage;
  uVar3 = pPager->nPage + 1;
  pPager->nPage = uVar3;
  bVar8 = uVar3 < uVar1 * 4;
  ppPVar7 = (Page **)(ulong)CONCAT31((int3)(uVar3 >> 8),99999 < uVar3 || bVar8);
  if (99999 >= uVar3 && !bVar8) {
    ppPVar5 = (Page **)SyMemBackendAlloc(pPager->pAllocator,uVar1 << 4);
    ppPVar7 = ppPVar5;
    if (ppPVar5 != (Page **)0x0) {
      if ((uVar1 & 0xfffffff) != 0) {
        ppPVar6 = (Page **)((long)ppPVar5 + (ulong)(uVar1 << 4));
        do {
          *(undefined1 *)ppPVar7 = 0;
          if (ppPVar6 <= (Page **)((long)ppPVar7 + 1)) break;
          *(undefined1 *)((long)ppPVar7 + 1) = 0;
          if (ppPVar6 <= (Page **)((long)ppPVar7 + 2)) break;
          *(undefined1 *)((long)ppPVar7 + 2) = 0;
          if (ppPVar6 <= (Page **)((long)ppPVar7 + 3)) break;
          *(undefined1 *)((long)ppPVar7 + 3) = 0;
          ppPVar7 = (Page **)((long)ppPVar7 + 4);
        } while (ppPVar7 < ppPVar6);
      }
      sVar4 = pPager->nPage;
      if (sVar4 != 0) {
        ppPVar7 = &pPager->pAll;
        do {
          pPVar2 = *ppPVar7;
          pPVar2->pNextCollide = (Page *)0x0;
          pPVar2->pPrevCollide = (Page *)0x0;
          uVar3 = (uint)pPVar2->pgno & uVar1 * 2 - 1;
          pPVar2->pNextCollide = ppPVar5[uVar3];
          if (ppPVar5[uVar3] != (Page *)0x0) {
            ppPVar5[uVar3]->pPrevCollide = pPVar2;
          }
          ppPVar5[uVar3] = pPVar2;
          ppPVar7 = &pPVar2->pNext;
          sVar4 = sVar4 - 1;
        } while (sVar4 != 0);
      }
      uVar3 = SyMemBackendFree(pPager->pAllocator,pPager->apHash);
      ppPVar7 = (Page **)(ulong)uVar3;
      pPager->apHash = ppPVar5;
      pPager->nSize = uVar1 * 2;
    }
  }
  return (int)ppPVar7;
}

Assistant:

static int pager_link_page(Pager *pPager,Page *pPage)
{
	sxu32 nBucket;
	/* Install in the corresponding bucket */
	nBucket = PAGE_HASH(pPage->pgno) & (pPager->nSize - 1);
	pPage->pNextCollide = pPager->apHash[nBucket];
	if( pPager->apHash[nBucket] ){
		pPager->apHash[nBucket]->pPrevCollide = pPage;
	}
	pPager->apHash[nBucket] = pPage;
	/* Link to the list of active pages */
	MACRO_LD_PUSH(pPager->pAll,pPage);
	pPager->nPage++;
	if( (pPager->nPage >= pPager->nSize * 4)  && pPager->nPage < 100000 ){
		/* Grow the hashtable */
		sxu32 nNewSize = pPager->nSize << 1;
		Page *pEntry,**apNew;
		sxu32 n;
		apNew = (Page **)SyMemBackendAlloc(pPager->pAllocator, nNewSize * sizeof(Page *));
		if( apNew ){
			sxu32 iBucket;
			/* Zero the new table */
			SyZero((void *)apNew, nNewSize * sizeof(Page *));
			/* Rehash all entries */
			n = 0;
			pEntry = pPager->pAll;
			for(;;){
				/* Loop one */
				if( n >= pPager->nPage ){
					break;
				}
				pEntry->pNextCollide = pEntry->pPrevCollide = 0;
				/* Install in the new bucket */
				iBucket = PAGE_HASH(pEntry->pgno) & (nNewSize - 1);
				pEntry->pNextCollide = apNew[iBucket];
				if( apNew[iBucket] ){
					apNew[iBucket]->pPrevCollide = pEntry;
				}
				apNew[iBucket] = pEntry;
				/* Point to the next entry */
				pEntry = pEntry->pNext;
				n++;
			}
			/* Release the old table and reflect the change */
			SyMemBackendFree(pPager->pAllocator,(void *)pPager->apHash);
			pPager->apHash = apNew;
			pPager->nSize  = nNewSize;
		}
	}
	return UNQLITE_OK;
}